

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomrimm_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  matches *res;
  rbitfield *bf;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else {
    ctx_local = (iasctx *)alwaysmatches(spos + 1);
    iVar1 = setrbf((match *)ctx_local->isa,(rbitfield *)v,ctx->atoms[spos]->expr);
    if (iVar1 == 0) {
      free((match *)ctx_local->isa);
      free(ctx_local);
      ctx_local = (iasctx *)0x0;
    }
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atomrimm_a APROTO {
	const struct rbitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	if (setrbf(res->m, bf, ctx->atoms[spos]->expr))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}